

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Binary_data * __thiscall
iqxmlrpc::Value::get_binary(Binary_data *__return_storage_ptr__,Value *this)

{
  Binary_data *pBVar1;
  Value *this_local;
  
  pBVar1 = cast<iqxmlrpc::Binary_data>(this);
  Binary_data::Binary_data(__return_storage_ptr__,pBVar1);
  return __return_storage_ptr__;
}

Assistant:

Binary_data Value::get_binary() const
{
  return Binary_data(*cast<Binary_data>());
}